

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

word * capnp::_::WireHelpers::copyMessage
                 (SegmentBuilder **segment,CapTableBuilder *capTable,WirePointer **dst,
                 WirePointer *src)

{
  ushort uVar1;
  BuilderArena *pBVar2;
  CapTableBuilder *pCVar3;
  byte bVar4;
  SegmentBuilder *pSVar5;
  anon_union_4_5_35ddcec3_for_WirePointer_1 aVar6;
  WirePointer *pWVar7;
  WirePointer *pWVar8;
  Exception *pEVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  WirePointer *pWVar13;
  word *result_1;
  uint uVar14;
  int iVar15;
  Exception *pEVar16;
  AllocateResult AVar17;
  WirePointer *dstRef;
  SegmentBuilder *subSegment;
  Exception *local_88;
  WirePointer *local_80;
  Fault local_70;
  DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> local_68;
  CapTableBuilder *local_48;
  uint local_40;
  uint local_3c;
  WirePointer *local_38;
  
  uVar14 = (src->offsetAndKind).value;
  iVar15 = (int)uVar14 >> 2;
  local_48 = capTable;
  switch(uVar14 & 3) {
  case 0:
    if ((src->field_1).upper32Bits == 0 && uVar14 == 0) {
      pWVar7 = *dst;
      pWVar7->offsetAndKind = 0;
      pWVar7->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
      return (word *)0x0;
    }
    uVar14 = (uint)(src->field_1).structRef.ptrCount.value +
             (uint)(src->field_1).structRef.dataSize.value;
    pWVar7 = *dst;
    if ((pWVar7->field_1).upper32Bits != 0 || (pWVar7->offsetAndKind).value != 0) {
      zeroObject(*segment,capTable,pWVar7);
    }
    if (uVar14 == 0) {
      local_88 = (Exception *)*dst;
      *(undefined4 *)&(local_88->ownFile).content.ptr = 0xfffffffc;
    }
    else {
      pSVar5 = *segment;
      local_88 = (Exception *)pSVar5->pos;
      if ((long)((long)(pSVar5->super_SegmentReader).ptr.ptr +
                ((pSVar5->super_SegmentReader).ptr.size_ * 8 - (long)local_88)) >> 3 <
          (long)(ulong)uVar14) {
        local_88 = (Exception *)0x0;
      }
      else {
        pSVar5->pos = (word *)(local_88->trace + ((ulong)uVar14 - 0xd));
      }
      if (local_88 == (Exception *)0x0) {
        AVar17 = BuilderArena::allocate
                           ((BuilderArena *)((*segment)->super_SegmentReader).arena,uVar14 + 1);
        pWVar8 = (WirePointer *)AVar17.words;
        pSVar5 = AVar17.segment;
        *segment = pSVar5;
        pWVar7 = *dst;
        (pWVar7->offsetAndKind).value =
             (int)AVar17.words - *(int *)&(pSVar5->super_SegmentReader).ptr.ptr & 0xfffffff8U | 2;
        pWVar7->field_1 =
             (anon_union_4_5_35ddcec3_for_WirePointer_1)(pSVar5->super_SegmentReader).id.value;
        *dst = pWVar8;
        (pWVar8->offsetAndKind).value = 0;
        local_88 = (Exception *)(pWVar8 + 1);
      }
      else {
        ((*dst)->offsetAndKind).value =
             ((uint)((ulong)((long)local_88 - (long)*dst) >> 1) & 0xfffffffc) - 4;
      }
    }
    pEVar16 = (Exception *)*segment;
    uVar1 = *(ushort *)&src->field_1;
    uVar12 = (ulong)(src->field_1).structRef.ptrCount.value;
    if (uVar1 != 0) {
      memcpy(local_88,src + (long)iVar15 + 1,(ulong)((uint)uVar1 * 8));
    }
    pCVar3 = local_48;
    if (uVar12 != 0) {
      pWVar7 = src + (long)iVar15 + 1 + uVar1;
      pEVar9 = (Exception *)(local_88->trace + ((ulong)uVar1 - 0xd));
      do {
        local_70.exception = pEVar9;
        local_68._0_8_ = pEVar16;
        copyMessage((SegmentBuilder **)&local_68,pCVar3,(WirePointer **)&local_70,pWVar7);
        pEVar9 = (Exception *)&(pEVar9->ownFile).content.size_;
        pWVar7 = pWVar7 + 1;
        uVar12 = uVar12 - 1;
      } while (uVar12 != 0);
    }
    pWVar7 = *dst;
    aVar6 = src->field_1;
    break;
  case 1:
    uVar14 = (src->field_1).upper32Bits;
    bVar4 = (byte)uVar14 & 7;
    if (bVar4 < 6) {
      uVar12 = (ulong)(uint)(&BITS_PER_ELEMENT_TABLE)[bVar4] * (ulong)(uVar14 >> 3) + 0x3f >> 6;
      pWVar7 = *dst;
      if ((pWVar7->field_1).upper32Bits != 0 || (pWVar7->offsetAndKind).value != 0) {
        zeroObject(*segment,capTable,pWVar7);
      }
      pSVar5 = *segment;
      pWVar7 = (WirePointer *)pSVar5->pos;
      iVar10 = (int)uVar12;
      uVar12 = uVar12 & 0xffffffff;
      if ((long)((long)(pSVar5->super_SegmentReader).ptr.ptr +
                ((pSVar5->super_SegmentReader).ptr.size_ * 8 - (long)pWVar7)) >> 3 < (long)uVar12) {
        pWVar7 = (WirePointer *)0x0;
      }
      else {
        pSVar5->pos = (word *)(pWVar7 + uVar12);
      }
      if (pWVar7 == (WirePointer *)0x0) {
        pBVar2 = (BuilderArena *)((*segment)->super_SegmentReader).arena;
        if (0x1fffffff < iVar10 + 1U) {
          allocate::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)&local_68);
        }
        AVar17 = BuilderArena::allocate(pBVar2,iVar10 + 1U);
        pWVar7 = (WirePointer *)AVar17.words;
        pSVar5 = AVar17.segment;
        *segment = pSVar5;
        pWVar8 = *dst;
        (pWVar8->offsetAndKind).value =
             (int)AVar17.words - *(int *)&(pSVar5->super_SegmentReader).ptr.ptr & 0xfffffff8U | 2;
        pWVar8->field_1 =
             (anon_union_4_5_35ddcec3_for_WirePointer_1)(pSVar5->super_SegmentReader).id.value;
        *dst = pWVar7;
        (pWVar7->offsetAndKind).value = 1;
        pWVar7 = pWVar7 + 1;
      }
      else {
        ((*dst)->offsetAndKind).value =
             ((uint)((ulong)((long)pWVar7 - (long)*dst) >> 1) & 0xfffffffc) - 3;
      }
      if (iVar10 != 0) {
        memcpy(pWVar7,src + (long)iVar15 + 1,(ulong)(uint)(iVar10 << 3));
      }
      (*dst)->field_1 = src->field_1;
      return (word *)pWVar7;
    }
    if ((uVar14 & 7) != 6) {
      uVar11 = uVar14 >> 3;
      if (uVar11 == 0x1fffffff) {
        copyMessage::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)&local_70);
      }
      pWVar7 = *dst;
      if ((pWVar7->field_1).upper32Bits != 0 || (pWVar7->offsetAndKind).value != 0) {
        zeroObject(*segment,local_48,pWVar7);
      }
      pSVar5 = *segment;
      pWVar7 = (WirePointer *)pSVar5->pos;
      if ((long)((long)(pSVar5->super_SegmentReader).ptr.ptr +
                ((pSVar5->super_SegmentReader).ptr.size_ * 8 - (long)pWVar7)) >> 3 <
          (long)(ulong)(uVar11 + 1)) {
        pWVar7 = (WirePointer *)0x0;
      }
      else {
        pSVar5->pos = (word *)(pWVar7 + (uVar11 + 1));
      }
      pWVar8 = src + (long)iVar15 + 1;
      if (pWVar7 == (WirePointer *)0x0) {
        pBVar2 = (BuilderArena *)((*segment)->super_SegmentReader).arena;
        if (0xffffffef < uVar14) {
          allocate::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)&local_68);
        }
        AVar17 = BuilderArena::allocate(pBVar2,uVar11 + 2);
        pWVar7 = (WirePointer *)AVar17.words;
        pSVar5 = AVar17.segment;
        *segment = pSVar5;
        pWVar13 = *dst;
        (pWVar13->offsetAndKind).value =
             (int)AVar17.words - *(int *)&(pSVar5->super_SegmentReader).ptr.ptr & 0xfffffff8U | 2;
        pWVar13->field_1 =
             (anon_union_4_5_35ddcec3_for_WirePointer_1)(pSVar5->super_SegmentReader).id.value;
        *dst = pWVar7;
        (pWVar7->offsetAndKind).value = 1;
        pWVar7 = pWVar7 + 1;
      }
      else {
        ((*dst)->offsetAndKind).value =
             ((uint)((ulong)((long)pWVar7 - (long)*dst) >> 1) & 0xfffffffc) - 3;
      }
      ((*dst)->field_1).upper32Bits = (src->field_1).upper32Bits | 7;
      *(WirePointer *)&(pWVar7->offsetAndKind).value = *pWVar8;
      uVar14 = (pWVar8->offsetAndKind).value;
      local_68.left = uVar14 & 3;
      local_68.result = local_68.left == 0;
      local_68.right = STRUCT;
      local_68.op.content.ptr = " == ";
      local_68.op.content.size_ = 5;
      if (local_68.result) {
        local_40 = uVar14 >> 2 & 0x1fffffff;
        if (local_40 == 0) {
          return (word *)pWVar7;
        }
        pWVar13 = src + (long)iVar15 + 2;
        local_80 = pWVar7 + 1;
        local_3c = 0;
        local_38 = pWVar8;
        do {
          pEVar16 = (Exception *)*segment;
          uVar1 = *(ushort *)&local_38->field_1;
          uVar12 = (ulong)(local_38->field_1).structRef.ptrCount.value;
          if (uVar1 != 0) {
            memcpy(local_80,pWVar13,(ulong)((uint)uVar1 * 8));
          }
          pCVar3 = local_48;
          if (uVar12 != 0) {
            pWVar8 = pWVar13 + uVar1;
            pEVar9 = (Exception *)(local_80 + uVar1);
            do {
              local_70.exception = pEVar9;
              local_68._0_8_ = pEVar16;
              copyMessage((SegmentBuilder **)&local_68,pCVar3,(WirePointer **)&local_70,pWVar8);
              pEVar9 = (Exception *)&(pEVar9->ownFile).content.size_;
              pWVar8 = pWVar8 + 1;
              uVar12 = uVar12 - 1;
            } while (uVar12 != 0);
          }
          uVar12 = (ulong)(((uint)(local_38->field_1).structRef.ptrCount.value +
                           (uint)(local_38->field_1).structRef.dataSize.value) * 8);
          pWVar13 = (WirePointer *)((long)&(pWVar13->offsetAndKind).value + uVar12);
          local_80 = (WirePointer *)((long)&(local_80->offsetAndKind).value + uVar12);
          local_3c = local_3c + 1;
        } while (local_3c != local_40);
        return (word *)pWVar7;
      }
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[48]>
                (&local_70,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x3f3,FAILED,"srcTag->kind() == WirePointer::STRUCT",
                 "_kjCondition,\"INLINE_COMPOSITE of lists is not yet supported.\"",&local_68,
                 (char (*) [48])"INLINE_COMPOSITE of lists is not yet supported.");
      kj::_::Debug::Fault::fatal(&local_70);
    }
    uVar14 = uVar14 >> 3;
    pWVar7 = *dst;
    if ((pWVar7->field_1).upper32Bits != 0 || (pWVar7->offsetAndKind).value != 0) {
      zeroObject(*segment,capTable,pWVar7);
    }
    pSVar5 = *segment;
    local_88 = (Exception *)pSVar5->pos;
    if ((long)((long)(pSVar5->super_SegmentReader).ptr.ptr +
              ((pSVar5->super_SegmentReader).ptr.size_ * 8 - (long)local_88)) >> 3 <
        (long)(ulong)uVar14) {
      local_88 = (Exception *)0x0;
    }
    else {
      pSVar5->pos = (word *)(local_88->trace + ((ulong)uVar14 - 0xd));
    }
    if (local_88 == (Exception *)0x0) {
      pBVar2 = (BuilderArena *)((*segment)->super_SegmentReader).arena;
      if (uVar14 == 0x1fffffff) {
        allocate::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)&local_68);
      }
      AVar17 = BuilderArena::allocate(pBVar2,uVar14 + 1);
      pWVar8 = (WirePointer *)AVar17.words;
      pSVar5 = AVar17.segment;
      *segment = pSVar5;
      pWVar7 = *dst;
      (pWVar7->offsetAndKind).value =
           (int)AVar17.words - *(int *)&(pSVar5->super_SegmentReader).ptr.ptr & 0xfffffff8U | 2;
      pWVar7->field_1 =
           (anon_union_4_5_35ddcec3_for_WirePointer_1)(pSVar5->super_SegmentReader).id.value;
      *dst = pWVar8;
      (pWVar8->offsetAndKind).value = 1;
      local_88 = (Exception *)(pWVar8 + 1);
    }
    else {
      ((*dst)->offsetAndKind).value =
           ((uint)((ulong)((long)local_88 - (long)*dst) >> 1) & 0xfffffffc) - 3;
    }
    pCVar3 = local_48;
    if (7 < (src->field_1).upper32Bits) {
      pWVar7 = src + iVar15;
      uVar12 = (ulong)((src->field_1).upper32Bits >> 3);
      pEVar16 = local_88;
      do {
        pWVar7 = pWVar7 + 1;
        local_68._0_8_ = *segment;
        local_70.exception = pEVar16;
        copyMessage((SegmentBuilder **)&local_68,pCVar3,(WirePointer **)&local_70,pWVar7);
        pEVar16 = (Exception *)&(pEVar16->ownFile).content.size_;
        uVar12 = uVar12 - 1;
      } while (uVar12 != 0);
    }
    pWVar7 = *dst;
    aVar6.upper32Bits = (src->field_1).upper32Bits & 0xfffffff8 | 6;
    break;
  case 2:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[48]>
              ((Fault *)&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0x404,FAILED,(char *)0x0,"\"Unchecked messages cannot contain far pointers.\"",
               (char (*) [48])"Unchecked messages cannot contain far pointers.");
    kj::_::Debug::Fault::fatal((Fault *)&local_68);
  case 3:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[70]>
              ((Fault *)&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0x401,FAILED,(char *)0x0,
               "\"Unchecked messages cannot contain OTHER pointers (e.g. capabilities).\"",
               (char (*) [70])
               "Unchecked messages cannot contain OTHER pointers (e.g. capabilities).");
    kj::_::Debug::Fault::fatal((Fault *)&local_68);
  }
  (pWVar7->field_1).upper32Bits = (uint32_t)aVar6;
  return (word *)local_88;
}

Assistant:

static word* copyMessage(
      SegmentBuilder*& segment, CapTableBuilder* capTable,
      WirePointer*& dst, const WirePointer* src) {
    // Not always-inline because it's recursive.

    switch (src->kind()) {
      case WirePointer::STRUCT: {
        if (src->isNull()) {
          zeroMemory(dst);
          return nullptr;
        } else {
          const word* srcPtr = src->target(nullptr);
          word* dstPtr = allocate(
              dst, segment, capTable, src->structRef.wordSize(), WirePointer::STRUCT, nullptr);

          copyStruct(segment, capTable, dstPtr, srcPtr, src->structRef.dataSize.get(),
                     src->structRef.ptrCount.get());

          dst->structRef.set(src->structRef.dataSize.get(), src->structRef.ptrCount.get());
          return dstPtr;
        }
      }
      case WirePointer::LIST: {
        switch (src->listRef.elementSize()) {
          case ElementSize::VOID:
          case ElementSize::BIT:
          case ElementSize::BYTE:
          case ElementSize::TWO_BYTES:
          case ElementSize::FOUR_BYTES:
          case ElementSize::EIGHT_BYTES: {
            auto wordCount = roundBitsUpToWords(
                upgradeBound<uint64_t>(src->listRef.elementCount()) *
                dataBitsPerElement(src->listRef.elementSize()));
            const word* srcPtr = src->target(nullptr);
            word* dstPtr = allocate(dst, segment, capTable, wordCount, WirePointer::LIST, nullptr);
            copyMemory(dstPtr, srcPtr, wordCount);

            dst->listRef.set(src->listRef.elementSize(), src->listRef.elementCount());
            return dstPtr;
          }

          case ElementSize::POINTER: {
            const WirePointer* srcRefs = reinterpret_cast<const WirePointer*>(src->target(nullptr));
            WirePointer* dstRefs = reinterpret_cast<WirePointer*>(
                allocate(dst, segment, capTable, src->listRef.elementCount() *
                    (ONE * POINTERS / ELEMENTS) * WORDS_PER_POINTER,
                    WirePointer::LIST, nullptr));

            for (auto i: kj::zeroTo(src->listRef.elementCount() * (ONE * POINTERS / ELEMENTS))) {
              SegmentBuilder* subSegment = segment;
              WirePointer* dstRef = dstRefs + i;
              copyMessage(subSegment, capTable, dstRef, srcRefs + i);
            }

            dst->listRef.set(ElementSize::POINTER, src->listRef.elementCount());
            return reinterpret_cast<word*>(dstRefs);
          }

          case ElementSize::INLINE_COMPOSITE: {
            const word* srcPtr = src->target(nullptr);
            word* dstPtr = allocate(dst, segment, capTable,
                assertMaxBits<SEGMENT_WORD_COUNT_BITS>(
                    src->listRef.inlineCompositeWordCount() + POINTER_SIZE_IN_WORDS,
                    []() { KJ_FAIL_ASSERT("list too big to fit in a segment"); }),
                WirePointer::LIST, nullptr);

            dst->listRef.setInlineComposite(src->listRef.inlineCompositeWordCount());

            const WirePointer* srcTag = reinterpret_cast<const WirePointer*>(srcPtr);
            copyMemory(reinterpret_cast<WirePointer*>(dstPtr), srcTag);

            const word* srcElement = srcPtr + POINTER_SIZE_IN_WORDS;
            word* dstElement = dstPtr + POINTER_SIZE_IN_WORDS;

            KJ_ASSERT(srcTag->kind() == WirePointer::STRUCT,
                "INLINE_COMPOSITE of lists is not yet supported.");

            for (auto i KJ_UNUSED: kj::zeroTo(srcTag->inlineCompositeListElementCount())) {
              copyStruct(segment, capTable, dstElement, srcElement,
                  srcTag->structRef.dataSize.get(), srcTag->structRef.ptrCount.get());
              srcElement += srcTag->structRef.wordSize();
              dstElement += srcTag->structRef.wordSize();
            }
            return dstPtr;
          }
        }
        break;
      }
      case WirePointer::OTHER:
        KJ_FAIL_REQUIRE("Unchecked messages cannot contain OTHER pointers (e.g. capabilities).");
        break;
      case WirePointer::FAR:
        KJ_FAIL_REQUIRE("Unchecked messages cannot contain far pointers.");
        break;
    }

    return nullptr;
  }